

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::AdvancedIndirectAddressingCase2CS::Run
          (AdvancedIndirectAddressingCase2CS *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  GLuint program;
  GLint GVar4;
  void *pvVar5;
  long lVar6;
  byte bVar7;
  undefined1 *data;
  GLuint i;
  float fVar8;
  GLint blocksC;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_34;
  
  data = local_68;
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90dc,&local_34);
  lVar6 = 0x10;
  if (7 < local_34) {
    local_68._0_8_ = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "\nlayout(local_size_x = 4) in;\nlayout(binding = 0, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[4];\n};\nuniform int g_material_id;\nvoid main() {\n  if (g_material_id == 0) color[gl_LocalInvocationIndex] = g_material[0].color;\n  else if (g_material_id == 1) color[gl_LocalInvocationIndex] = g_material[1].color;\n  else if (g_material_id == 2) color[gl_LocalInvocationIndex] = g_material[2].color;\n  else if (g_material_id == 3) color[gl_LocalInvocationIndex] = g_material[3].color;\n}"
               ,"");
    program = ShaderStorageBufferObjectBase::CreateProgramCS
                        (&this->super_ShaderStorageBufferObjectBase,(string *)local_68);
    this->m_program = program;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
      program = this->m_program;
    }
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar6 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers(this_00,5,this->m_storage_buffer);
      local_68._8_8_ = 0;
      local_58._8_8_ = 0;
      local_68._0_8_ = (pointer)0x3f800000;
      local_58._M_allocated_capacity = 0x3f800000;
      local_48 = 0x3f8000003f800000;
      uStack_40 = 0x3f800000;
      lVar6 = 0;
      do {
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(GLuint)lVar6,this->m_storage_buffer[lVar6]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0xc,data,0x88e8);
        lVar6 = lVar6 + 1;
        data = data + 0xc;
      } while (lVar6 != 4);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_material_id");
      glu::CallLogWrapper::glUniform1i(this_00,GVar4,1);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x40,1);
      lVar6 = -1;
      if (pvVar5 != (void *)0x0) {
        bVar7 = 1;
        lVar6 = 0;
        do {
          fVar1 = *(float *)((long)pvVar5 + lVar6);
          if ((fVar1 != (float)local_68._12_4_) || (NAN(fVar1) || NAN((float)local_68._12_4_))) {
            fVar8 = *(float *)((long)pvVar5 + lVar6 + 4);
LAB_00c7ff27:
            anon_unknown_0::Output
                      ("Received: %f, %f, %f, but expected: %f, %f, %f\n",SUB84((double)fVar1,0),
                       (double)fVar8,(double)*(float *)((long)pvVar5 + lVar6 + 8),
                       (double)(float)local_68._12_4_,
                       (double)(float)local_58._M_allocated_capacity._0_4_,
                       (double)(float)local_58._M_allocated_capacity._4_4_);
            bVar7 = 0;
          }
          else {
            fVar8 = *(float *)((long)pvVar5 + lVar6 + 4);
            if ((fVar8 != (float)local_58._M_allocated_capacity._0_4_) ||
               (NAN(fVar8) || NAN((float)local_58._M_allocated_capacity._0_4_))) goto LAB_00c7ff27;
            fVar2 = *(float *)((long)pvVar5 + lVar6 + 8);
            if ((fVar2 != (float)local_58._M_allocated_capacity._4_4_) ||
               (NAN(fVar2) || NAN((float)local_58._M_allocated_capacity._4_4_))) goto LAB_00c7ff27;
          }
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x40);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_material_id");
        glu::CallLogWrapper::glUniform1i(this_00,GVar4,3);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x40,1);
        lVar6 = -1;
        if (pvVar5 != (void *)0x0) {
          lVar6 = 0;
          do {
            fVar1 = *(float *)((long)pvVar5 + lVar6);
            if ((fVar1 != local_48._4_4_) || (NAN(fVar1) || NAN(local_48._4_4_))) {
              fVar8 = *(float *)((long)pvVar5 + lVar6 + 4);
LAB_00c8002f:
              anon_unknown_0::Output
                        ("Received: %f, %f, %f, but expected: %f, %f, %f\n",SUB84((double)fVar1,0),
                         (double)fVar8,(double)*(float *)((long)pvVar5 + lVar6 + 8),
                         (double)local_48._4_4_,(double)(float)uStack_40,(double)uStack_40._4_4_);
              bVar7 = 0;
            }
            else {
              fVar8 = *(float *)((long)pvVar5 + lVar6 + 4);
              if ((fVar8 != (float)uStack_40) || (NAN(fVar8) || NAN((float)uStack_40)))
              goto LAB_00c8002f;
              fVar2 = *(float *)((long)pvVar5 + lVar6 + 8);
              if ((fVar2 != uStack_40._4_4_) || (NAN(fVar2) || NAN(uStack_40._4_4_)))
              goto LAB_00c8002f;
            }
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x40);
          lVar6 = -(ulong)(~bVar7 & 1);
        }
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		GLint blocksC;
		glGetIntegerv(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, &blocksC);
		if (blocksC < 8)
			return NOT_SUPPORTED;
		bool			  status = true;
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(binding = 0, std430) buffer Material {" NL "  vec3 color;" NL
			   "} g_material[4];" NL "layout(binding = 4, std430) buffer OutputBuffer {" NL "  vec3 color[4];" NL
			   "};" NL "uniform int g_material_id;" NL "void main() {" NL
			   "  if (g_material_id == 0) color[gl_LocalInvocationIndex] = g_material[0].color;" NL
			   "  else if (g_material_id == 1) color[gl_LocalInvocationIndex] = g_material[1].color;" NL
			   "  else if (g_material_id == 2) color[gl_LocalInvocationIndex] = g_material[2].color;" NL
			   "  else if (g_material_id == 3) color[gl_LocalInvocationIndex] = g_material[3].color;" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(5, m_storage_buffer);

		/* material buffers */
		const float data[4][3] = {
			{ 1.0f, 0.0f, 0.0f }, { 0.0f, 1.0f, 0.0f }, { 0.0f, 0.0f, 1.0f }, { 1.0f, 1.0f, 0.0f }
		};
		for (GLuint i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
		}

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 4 * 4 * 4, 0, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 1);
		glDispatchCompute(1, 1, 1);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		const float* expected = &data[1][0];
		for (int i = 0; i < 4; ++i)
		{
			if (out_data[i * 4 + 0] != expected[0] || out_data[i * 4 + 1] != expected[1] ||
				out_data[i * 4 + 2] != expected[2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[0], expected[1], expected[2]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		expected = &data[3][0];
		for (int i = 0; i < 4; ++i)
		{
			if (out_data[i * 4 + 0] != expected[0] || out_data[i * 4 + 1] != expected[1] ||
				out_data[i * 4 + 2] != expected[2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[0], expected[1], expected[2]);
				status = false;
			}
		}

		if (!status)
		{
			return ERROR;
		}
		return NO_ERROR;
	}